

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O2

long __thiscall
gl4cts::anon_unknown_0::SACSubcaseBase::ValidateReadBuffer(SACSubcaseBase *this,Vec4 *expected)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  RenderContext *context;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  int x;
  int iVar7;
  int width;
  int iVar8;
  Surface referenceFrame;
  Surface renderedFrame;
  PixelBufferAccess local_58;
  
  iVar6 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext
            [4])();
  width = *(int *)CONCAT44(extraout_var,iVar6);
  iVar6 = ((int *)CONCAT44(extraout_var,iVar6))[1];
  tcu::Surface::Surface(&renderedFrame,width,iVar6);
  tcu::Surface::Surface(&referenceFrame,width,iVar6);
  context = ((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx;
  tcu::Surface::getAccess(&local_58,&renderedFrame);
  iVar8 = 0;
  glu::readPixels(context,0,0,&local_58);
  if (width < 1) {
    width = 0;
  }
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  for (; iVar8 != iVar6; iVar8 = iVar8 + 1) {
    fVar1 = expected->m_data[0];
    fVar2 = expected->m_data[1];
    fVar3 = expected->m_data[2];
    fVar4 = expected->m_data[3];
    for (iVar7 = 0; width != iVar7; iVar7 = iVar7 + 1) {
      *(int *)((long)referenceFrame.m_pixels.m_ptr +
              (long)(referenceFrame.m_width * iVar8 + iVar7) * 4) =
           (int)(fVar3 * 255.0) << 0x10 | (int)(fVar4 * 255.0) << 0x18 |
           (int)(fVar2 * 255.0) << 8 | (int)(fVar1 * 255.0);
    }
  }
  bVar5 = tcu::fuzzyCompare(((this->super_SubcaseBase).super_GLWrapper.m_context)->m_testCtx->m_log,
                            "Result","Image comparison result",&referenceFrame,&renderedFrame,0.05,
                            COMPARE_LOG_RESULT);
  tcu::Surface::~Surface(&referenceFrame);
  tcu::Surface::~Surface(&renderedFrame);
  return (ulong)bVar5 - 1;
}

Assistant:

long ValidateReadBuffer(const Vec4& expected)
	{
		const tcu::RenderTarget& renderTarget = m_context.getRenderContext().getRenderTarget();
		int						 viewportW	= renderTarget.getWidth();
		int						 viewportH	= renderTarget.getHeight();
		tcu::Surface			 renderedFrame(viewportW, viewportH);
		tcu::Surface			 referenceFrame(viewportW, viewportH);

		glu::readPixels(m_context.getRenderContext(), 0, 0, renderedFrame.getAccess());

		for (int y = 0; y < viewportH; ++y)
		{
			for (int x = 0; x < viewportW; ++x)
			{
				referenceFrame.setPixel(
					x, y, tcu::RGBA(static_cast<int>(expected[0] * 255), static_cast<int>(expected[1] * 255),
									static_cast<int>(expected[2] * 255), static_cast<int>(expected[3] * 255)));
			}
		}
		tcu::TestLog& log = m_context.getTestContext().getLog();
		bool isOk = tcu::fuzzyCompare(log, "Result", "Image comparison result", referenceFrame, renderedFrame, 0.05f,
									  tcu::COMPARE_LOG_RESULT);
		return (isOk ? NO_ERROR : ERROR);
	}